

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image-util.cc
# Opt level: O0

bool tinyusdz::ACEScg_to_linear_sRGB
               (vector<float,_std::allocator<float>_> *in_img,size_t width,size_t height,
               size_t channels,vector<float,_std::allocator<float>_> *out_img,string *err)

{
  float fVar1;
  float fVar2;
  float fVar3;
  value_type vVar4;
  ostream *poVar5;
  size_type sVar6;
  const_reference pvVar7;
  reference pvVar8;
  vector<float,_std::allocator<float>_> *args_1;
  value_type local_af4;
  value_type local_af0;
  value_type local_aec;
  value_type local_adc;
  value_type local_ad8;
  value_type local_ad4;
  float out_rgb_1 [3];
  float a;
  float b_1;
  float g_1;
  float r_1;
  size_t x_1;
  size_t y_1;
  float out_rgb [3];
  float b;
  float g;
  float r;
  size_t x;
  size_t y;
  size_type local_a50;
  undefined1 local_a48 [16];
  string local_a38 [32];
  string local_a18;
  ostringstream local_9f8 [8];
  ostringstream ss_e_5;
  string local_880 [32];
  ostringstream local_860 [8];
  ostringstream ss_e_4;
  string local_6e8 [39];
  allocator local_6c1;
  string local_6c0;
  string local_6a0;
  ostringstream local_680 [8];
  ostringstream ss_e_3;
  string local_508 [32];
  ostringstream local_4e8 [8];
  ostringstream ss_e_2;
  string local_370 [32];
  ostringstream local_350 [8];
  ostringstream ss_e_1;
  string local_1d8 [32];
  ostringstream local_1b8 [8];
  ostringstream ss_e;
  string *err_local;
  vector<float,_std::allocator<float>_> *out_img_local;
  size_t channels_local;
  size_t height_local;
  size_t width_local;
  vector<float,_std::allocator<float>_> *in_img_local;
  
  out_img_local = (vector<float,_std::allocator<float>_> *)channels;
  channels_local = height;
  height_local = width;
  width_local = (size_t)in_img;
  if (width == 0) {
    ::std::__cxx11::ostringstream::ostringstream(local_1b8);
    poVar5 = ::std::operator<<((ostream *)local_1b8,"[error]");
    poVar5 = ::std::operator<<(poVar5,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/image-util.cc"
                              );
    poVar5 = ::std::operator<<(poVar5,":");
    poVar5 = ::std::operator<<(poVar5,"ACEScg_to_linear_sRGB");
    poVar5 = ::std::operator<<(poVar5,"():");
    poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x3a2);
    ::std::operator<<(poVar5," ");
    poVar5 = ::std::operator<<((ostream *)local_1b8,"width is zero.");
    ::std::operator<<(poVar5,"\n");
    if (err != (string *)0x0) {
      ::std::__cxx11::ostringstream::str();
      ::std::__cxx11::string::operator+=((string *)err,local_1d8);
      ::std::__cxx11::string::~string(local_1d8);
    }
    in_img_local._7_1_ = 0;
    ::std::__cxx11::ostringstream::~ostringstream(local_1b8);
  }
  else if (height == 0) {
    ::std::__cxx11::ostringstream::ostringstream(local_350);
    poVar5 = ::std::operator<<((ostream *)local_350,"[error]");
    poVar5 = ::std::operator<<(poVar5,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/image-util.cc"
                              );
    poVar5 = ::std::operator<<(poVar5,":");
    poVar5 = ::std::operator<<(poVar5,"ACEScg_to_linear_sRGB");
    poVar5 = ::std::operator<<(poVar5,"():");
    poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x3a6);
    ::std::operator<<(poVar5," ");
    poVar5 = ::std::operator<<((ostream *)local_350,"height is zero.");
    ::std::operator<<(poVar5,"\n");
    if (err != (string *)0x0) {
      ::std::__cxx11::ostringstream::str();
      ::std::__cxx11::string::operator+=((string *)err,local_370);
      ::std::__cxx11::string::~string(local_370);
    }
    in_img_local._7_1_ = 0;
    ::std::__cxx11::ostringstream::~ostringstream(local_350);
  }
  else if (channels == 0) {
    ::std::__cxx11::ostringstream::ostringstream(local_4e8);
    poVar5 = ::std::operator<<((ostream *)local_4e8,"[error]");
    poVar5 = ::std::operator<<(poVar5,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/image-util.cc"
                              );
    poVar5 = ::std::operator<<(poVar5,":");
    poVar5 = ::std::operator<<(poVar5,"ACEScg_to_linear_sRGB");
    poVar5 = ::std::operator<<(poVar5,"():");
    poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x3aa);
    ::std::operator<<(poVar5," ");
    poVar5 = ::std::operator<<((ostream *)local_4e8,"channels is zero.");
    ::std::operator<<(poVar5,"\n");
    if (err != (string *)0x0) {
      ::std::__cxx11::ostringstream::str();
      ::std::__cxx11::string::operator+=((string *)err,local_508);
      ::std::__cxx11::string::~string(local_508);
    }
    in_img_local._7_1_ = 0;
    ::std::__cxx11::ostringstream::~ostringstream(local_4e8);
  }
  else if ((channels == 3) || (channels == 4)) {
    if (out_img == (vector<float,_std::allocator<float>_> *)0x0) {
      ::std::__cxx11::ostringstream::ostringstream(local_860);
      poVar5 = ::std::operator<<((ostream *)local_860,"[error]");
      poVar5 = ::std::operator<<(poVar5,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/image-util.cc"
                                );
      poVar5 = ::std::operator<<(poVar5,":");
      poVar5 = ::std::operator<<(poVar5,"ACEScg_to_linear_sRGB");
      poVar5 = ::std::operator<<(poVar5,"():");
      poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x3b2);
      ::std::operator<<(poVar5," ");
      poVar5 = ::std::operator<<((ostream *)local_860,"`out_img` is nullptr.");
      ::std::operator<<(poVar5,"\n");
      if (err != (string *)0x0) {
        ::std::__cxx11::ostringstream::str();
        ::std::__cxx11::string::operator+=((string *)err,local_880);
        ::std::__cxx11::string::~string(local_880);
      }
      in_img_local._7_1_ = 0;
      ::std::__cxx11::ostringstream::~ostringstream(local_860);
    }
    else {
      args_1 = out_img;
      sVar6 = ::std::vector<float,_std::allocator<float>_>::size(in_img);
      if (sVar6 == height_local * channels_local * (long)out_img_local) {
        sVar6 = ::std::vector<float,_std::allocator<float>_>::size
                          ((vector<float,_std::allocator<float>_> *)width_local);
        ::std::vector<float,_std::allocator<float>_>::resize(out_img,sVar6);
        if (out_img_local == (vector<float,_std::allocator<float>_> *)0x3) {
          for (x = 0; x < channels_local; x = x + 1) {
            for (_g = 0; _g < height_local; _g = _g + 1) {
              pvVar7 = ::std::vector<float,_std::allocator<float>_>::operator[]
                                 ((vector<float,_std::allocator<float>_> *)width_local,
                                  (x * height_local + _g) * 3);
              fVar1 = *pvVar7;
              pvVar7 = ::std::vector<float,_std::allocator<float>_>::operator[]
                                 ((vector<float,_std::allocator<float>_> *)width_local,
                                  (x * height_local + _g) * 3 + 1);
              fVar2 = *pvVar7;
              pvVar7 = ::std::vector<float,_std::allocator<float>_>::operator[]
                                 ((vector<float,_std::allocator<float>_> *)width_local,
                                  (x * height_local + _g) * 3 + 2);
              fVar3 = *pvVar7;
              local_ad4 = (fVar1 * 1.705052 - fVar2 * 0.621792) - fVar3 * 0.083258;
              local_ad8 = fVar1 * -0.130257 + fVar3 * -0.012033211;
              local_adc = (fVar1 * -0.024004 - fVar2 * 0.128969) + fVar3 * 1.152972;
              if (local_ad4 < 0.0) {
                local_ad4 = 0.0;
              }
              if (local_ad8 < 0.0) {
                local_ad8 = 0.0;
              }
              if (local_adc < 0.0) {
                local_adc = 0.0;
              }
              pvVar8 = ::std::vector<float,_std::allocator<float>_>::operator[]
                                 (out_img,(x * height_local + _g) * 3);
              *pvVar8 = local_ad4;
              pvVar8 = ::std::vector<float,_std::allocator<float>_>::operator[]
                                 (out_img,(x * height_local + _g) * 3 + 1);
              *pvVar8 = local_ad8;
              pvVar8 = ::std::vector<float,_std::allocator<float>_>::operator[]
                                 (out_img,(x * height_local + _g) * 3 + 2);
              *pvVar8 = local_adc;
            }
          }
        }
        else {
          for (x_1 = 0; x_1 < channels_local; x_1 = x_1 + 1) {
            for (_g_1 = 0; _g_1 < height_local; _g_1 = _g_1 + 1) {
              pvVar7 = ::std::vector<float,_std::allocator<float>_>::operator[]
                                 ((vector<float,_std::allocator<float>_> *)width_local,
                                  (x_1 * height_local + _g_1) * 4);
              fVar1 = *pvVar7;
              pvVar7 = ::std::vector<float,_std::allocator<float>_>::operator[]
                                 ((vector<float,_std::allocator<float>_> *)width_local,
                                  (x_1 * height_local + _g_1) * 4 + 1);
              fVar2 = *pvVar7;
              pvVar7 = ::std::vector<float,_std::allocator<float>_>::operator[]
                                 ((vector<float,_std::allocator<float>_> *)width_local,
                                  (x_1 * height_local + _g_1) * 4 + 2);
              fVar3 = *pvVar7;
              pvVar7 = ::std::vector<float,_std::allocator<float>_>::operator[]
                                 ((vector<float,_std::allocator<float>_> *)width_local,
                                  (x_1 * height_local + _g_1) * 4 + 3);
              vVar4 = *pvVar7;
              local_aec = (fVar1 * 1.705052 - fVar2 * 0.621792) - fVar3 * 0.083258;
              local_af0 = fVar1 * -0.130257 + fVar3 * -0.012033211;
              local_af4 = (fVar1 * -0.024004 - fVar2 * 0.128969) + fVar3 * 1.152972;
              if (local_aec < 0.0) {
                local_aec = 0.0;
              }
              if (local_af0 < 0.0) {
                local_af0 = 0.0;
              }
              if (local_af4 < 0.0) {
                local_af4 = 0.0;
              }
              pvVar8 = ::std::vector<float,_std::allocator<float>_>::operator[]
                                 (out_img,(x_1 * height_local + _g_1) * 4);
              *pvVar8 = local_aec;
              pvVar8 = ::std::vector<float,_std::allocator<float>_>::operator[]
                                 (out_img,(x_1 * height_local + _g_1) * 4 + 1);
              *pvVar8 = local_af0;
              pvVar8 = ::std::vector<float,_std::allocator<float>_>::operator[]
                                 (out_img,(x_1 * height_local + _g_1) * 4 + 2);
              *pvVar8 = local_af4;
              pvVar8 = ::std::vector<float,_std::allocator<float>_>::operator[]
                                 (out_img,(x_1 * height_local + _g_1) * 4 + 3);
              *pvVar8 = vVar4;
            }
          }
        }
        in_img_local._7_1_ = 1;
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_9f8);
        poVar5 = ::std::operator<<((ostream *)local_9f8,"[error]");
        poVar5 = ::std::operator<<(poVar5,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/image-util.cc"
                                  );
        poVar5 = ::std::operator<<(poVar5,":");
        poVar5 = ::std::operator<<(poVar5,"ACEScg_to_linear_sRGB");
        poVar5 = ::std::operator<<(poVar5,"():");
        poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x3b7);
        ::std::operator<<(poVar5," ");
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_a38,"Input buffer size must be {}, but got {}",
                   (allocator *)(local_a48 + 0xf));
        local_a48._0_8_ = height_local * channels_local * (long)out_img_local;
        local_a50 = ::std::vector<float,_std::allocator<float>_>::size
                              ((vector<float,_std::allocator<float>_> *)width_local);
        fmt::format<unsigned_long,unsigned_long>
                  (&local_a18,(fmt *)local_a38,(string *)local_a48,&local_a50,
                   (unsigned_long *)args_1);
        poVar5 = ::std::operator<<((ostream *)local_9f8,(string *)&local_a18);
        ::std::operator<<(poVar5,"\n");
        ::std::__cxx11::string::~string((string *)&local_a18);
        ::std::__cxx11::string::~string(local_a38);
        ::std::allocator<char>::~allocator((allocator<char> *)(local_a48 + 0xf));
        if (err != (string *)0x0) {
          ::std::__cxx11::ostringstream::str();
          ::std::__cxx11::string::operator+=((string *)err,(string *)&y);
          ::std::__cxx11::string::~string((string *)&y);
        }
        in_img_local._7_1_ = 0;
        ::std::__cxx11::ostringstream::~ostringstream(local_9f8);
      }
    }
  }
  else {
    ::std::__cxx11::ostringstream::ostringstream(local_680);
    poVar5 = ::std::operator<<((ostream *)local_680,"[error]");
    poVar5 = ::std::operator<<(poVar5,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/image-util.cc"
                              );
    poVar5 = ::std::operator<<(poVar5,":");
    poVar5 = ::std::operator<<(poVar5,"ACEScg_to_linear_sRGB");
    poVar5 = ::std::operator<<(poVar5,"():");
    poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x3ae);
    ::std::operator<<(poVar5," ");
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&local_6c0,"channels must be 3 or 4, but got {}",&local_6c1);
    fmt::format<unsigned_long>(&local_6a0,&local_6c0,(unsigned_long *)&out_img_local);
    poVar5 = ::std::operator<<((ostream *)local_680,(string *)&local_6a0);
    ::std::operator<<(poVar5,"\n");
    ::std::__cxx11::string::~string((string *)&local_6a0);
    ::std::__cxx11::string::~string((string *)&local_6c0);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_6c1);
    if (err != (string *)0x0) {
      ::std::__cxx11::ostringstream::str();
      ::std::__cxx11::string::operator+=((string *)err,local_6e8);
      ::std::__cxx11::string::~string(local_6e8);
    }
    in_img_local._7_1_ = 0;
    ::std::__cxx11::ostringstream::~ostringstream(local_680);
  }
  return (bool)(in_img_local._7_1_ & 1);
}

Assistant:

bool ACEScg_to_linear_sRGB(const std::vector<float> &in_img, size_t width,
                         size_t height, size_t channels,
                         std::vector<float> *out_img, std::string *err) {

  if (width == 0) {
    PUSH_ERROR_AND_RETURN("width is zero.");
  }

  if (height == 0) {
    PUSH_ERROR_AND_RETURN("height is zero.");
  }

  if (channels == 0) {
    PUSH_ERROR_AND_RETURN("channels is zero.");
  }

  if ((channels != 3) && (channels != 4)) {
    PUSH_ERROR_AND_RETURN(fmt::format("channels must be 3 or 4, but got {}", channels));
  }

  if (out_img == nullptr) {
    PUSH_ERROR_AND_RETURN("`out_img` is nullptr.");
  }


  if (in_img.size() != (width * height * channels)) {
    PUSH_ERROR_AND_RETURN(fmt::format("Input buffer size must be {}, but got {}", (width * height * channels), in_img.size()));
  }

  out_img->resize(in_img.size());

  // inv(ACEScg_to_lin_sRGB)
  // 
  // https://www.shadertoy.com/view/WltSRB

  if (channels == 3) {
    for (size_t y = 0; y < height; y++) {
      for (size_t x = 0; x < width; x++) {
        float r, g, b;
        r = in_img[3 * (y * width + x) + 0];
        g = in_img[3 * (y * width + x) + 1];
        b = in_img[3 * (y * width + x) + 2];

        float out_rgb[3];
        out_rgb[0] =  1.705052f * r -0.621792f * g   -0.083258f * b;
        out_rgb[1] = -0.130257f * r + 1.140805f *  -0.010548f * b;
        out_rgb[2] = -0.024004f * r -0.128969f *g + 1.152972f * b;

        // clamp negative
        out_rgb[0] = (out_rgb[0] < 0.0f) ? 0.0f : out_rgb[0];
        out_rgb[1] = (out_rgb[1] < 0.0f) ? 0.0f : out_rgb[1];
        out_rgb[2] = (out_rgb[2] < 0.0f) ? 0.0f : out_rgb[2];

        (*out_img)[3 * (y * width + x) + 0] = out_rgb[0];
        (*out_img)[3 * (y * width + x) + 1] = out_rgb[1];
        (*out_img)[3 * (y * width + x) + 2] = out_rgb[2];
      }
    }

  } else { // rgba
    for (size_t y = 0; y < height; y++) {
      for (size_t x = 0; x < width; x++) {
        float r, g, b, a;
        r = in_img[4 * (y * width + x) + 0];
        g = in_img[4 * (y * width + x) + 1];
        b = in_img[4 * (y * width + x) + 2];
        a = in_img[4 * (y * width + x) + 3];

        float out_rgb[3];
        out_rgb[0] =  1.705052f * r -0.621792f * g   -0.083258f * b;
        out_rgb[1] = -0.130257f * r + 1.140805f *  -0.010548f * b;
        out_rgb[2] = -0.024004f * r -0.128969f *g + 1.152972f * b;

        // clamp negative value
        out_rgb[0] = (out_rgb[0] < 0.0f) ? 0.0f : out_rgb[0];
        out_rgb[1] = (out_rgb[1] < 0.0f) ? 0.0f : out_rgb[1];
        out_rgb[2] = (out_rgb[2] < 0.0f) ? 0.0f : out_rgb[2];

        (*out_img)[4 * (y * width + x) + 0] = out_rgb[0];
        (*out_img)[4 * (y * width + x) + 1] = out_rgb[1];
        (*out_img)[4 * (y * width + x) + 2] = out_rgb[2];
        (*out_img)[4 * (y * width + x) + 3] = a;
      }
    }
  }

  return true;
}